

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QString * __thiscall QDateTime::toString(QDateTime *this,DateFormat format)

{
  QLatin1StringView s;
  QStringView format_00;
  bool bVar1;
  TimeSpec TVar2;
  QDate atDateTime;
  QLocale *pQVar3;
  QDateTimePrivate *b;
  undefined4 in_EDX;
  QTime nameType;
  Data *in_RSI;
  Data *pDVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  pair<QDate,_QTime> pVar5;
  size_t RuntimeThreshold;
  size_t i;
  QString buf;
  pair<QDate,_QTime> p_1;
  pair<QDate,_QTime> p;
  undefined4 in_stack_fffffffffffffcc8;
  CaseSensitivity in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcdc;
  undefined2 uVar6;
  QChar in_stack_fffffffffffffcde;
  QChar c;
  QDateTimeData *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  DateFormat in_stack_fffffffffffffcec;
  QString *in_stack_fffffffffffffcf0;
  DateFormat format_01;
  QStringBuilder<char16_t,_QString> *in_stack_fffffffffffffcf8;
  int iVar7;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  QDate in_stack_fffffffffffffd18;
  QLocale *locale;
  QTimeZone *in_stack_fffffffffffffd30;
  storage_type_conflict *psVar8;
  ulong local_228;
  ulong local_218;
  QChar local_1f2 [16];
  undefined2 local_1d2;
  qint64 local_1b0;
  qint64 local_190;
  int local_188;
  QDate in_stack_fffffffffffffe98;
  QChar local_c2;
  qint64 local_c0;
  qint64 local_a0;
  int local_98;
  storage_type_conflict local_78 [8];
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  pDVar4 = in_RSI;
  QString::QString((QString *)0x5702a4);
  bVar1 = isValid((QDateTime *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  if (bVar1) {
    switch(in_EDX) {
    case 1:
    case 9:
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      pVar5 = getDateTime(in_stack_fffffffffffffce0);
      format_01 = (DateFormat)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
      local_1b0 = (qint64)pVar5.first.jd;
      local_188 = (int)pVar5.second.mds;
      uVar6 = (undefined2)pVar5.second.mds;
      c.ucs = pVar5.second.mds._2_2_;
      puStack_20 = (undefined1 *)CONCAT44(puStack_20._4_4_,local_188);
      local_190 = local_1b0;
      local_28 = (undefined1 *)local_1b0;
      toStringIsoDate(in_stack_fffffffffffffd18);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QString::~QString((QString *)0x570a72);
      bVar1 = QString::isEmpty((QString *)0x570a7f);
      if (bVar1) {
        QString::QString((QString *)0x570a92);
      }
      else {
        local_1d2 = 0x54;
        QTime::toString((QTime *)in_stack_fffffffffffffcf8,format_01);
        ::operator+((char16_t *)CONCAT26(c.ucs,CONCAT24(uVar6,in_stack_fffffffffffffcd8)),
                    (QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        ::operator+=((QString *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcf8);
        iVar7 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        QStringBuilder<char16_t,_QString>::~QStringBuilder
                  ((QStringBuilder<char16_t,_QString> *)0x570b0d);
        QString::~QString((QString *)0x570b1a);
        TVar2 = getSpec((QDateTimeData *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        if (TVar2 == UTC) {
          QChar::QChar<char16_t,_true>(local_1f2,L'Z');
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),c);
        }
        else if (TVar2 - OffsetFromUTC < 2) {
          in_stack_fffffffffffffcd4 =
               offsetFromUtc((QDateTime *)CONCAT26(c.ucs,CONCAT24(uVar6,TVar2)));
          toOffsetString(in_stack_fffffffffffffcec,iVar7);
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          QString::~QString((QString *)0x570c18);
        }
        QString::QString((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      }
      break;
    default:
    case 0:
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      pVar5 = getDateTime(in_stack_fffffffffffffce0);
      atDateTime = pVar5.first.jd;
      nameType = pVar5.second.mds;
      puStack_10 = (undefined1 *)CONCAT44(puStack_10._4_4_,nameType.mds);
      local_c0 = atDateTime.jd;
      local_a0 = atDateTime.jd;
      local_98 = nameType.mds;
      local_18 = (undefined1 *)atDateTime.jd;
      toStringTextDate(in_stack_fffffffffffffe98);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QString::~QString((QString *)0x570619);
      QChar::QChar<char16_t,_true>(&local_c2,L' ');
      pQVar3 = (QLocale *)
               QString::lastIndexOf
                         ((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          in_stack_fffffffffffffcde,in_stack_fffffffffffffccc);
      QTime::toString((QTime *)in_stack_fffffffffffffcf8,
                      (DateFormat)((ulong)in_stack_fffffffffffffcf0 >> 0x20));
      iVar7 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      ::operator+((char16_t *)
                  CONCAT26(in_stack_fffffffffffffcde.ucs,
                           CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
                  (QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      locale = pQVar3;
      QString::insert(in_stack_fffffffffffffcf0,
                      CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                      (QString *)&in_stack_fffffffffffffce0->data);
      QString::~QString((QString *)0x5706c9);
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x5706d6);
      QString::~QString((QString *)0x5706e3);
      TVar2 = timeSpec((QDateTime *)0x5706f0);
      if (TVar2 != LocalTime) {
        if (TVar2 == TimeZone) {
          b = Data::operator->(in_RSI);
          QLocale::c(&stack0xfffffffffffffe98,pQVar3);
          QTimeZone::displayName
                    (in_stack_fffffffffffffd30,(QDateTime *)atDateTime.jd,nameType.mds,locale);
          ::operator+((char16_t *)
                      CONCAT26(in_stack_fffffffffffffcde.ucs,
                               CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
                      (QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          ::operator+=((QString *)CONCAT44(TVar2,in_stack_fffffffffffffd00),
                       (QStringBuilder<char16_t,_QString> *)b);
          QStringBuilder<char16_t,_QString>::~QStringBuilder
                    ((QStringBuilder<char16_t,_QString> *)0x57083a);
          QString::~QString((QString *)0x570847);
          QLocale::~QLocale((QLocale *)0x570854);
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT26(in_stack_fffffffffffffcde.ucs,
                                      CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8))
                     ,CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          s.m_data._0_4_ = in_stack_fffffffffffffce8;
          s.m_size = (qsizetype)in_stack_fffffffffffffce0;
          s.m_data._4_4_ = in_stack_fffffffffffffcec;
          QString::operator+=((QString *)
                              CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),s);
          TVar2 = getSpec((QDateTimeData *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          if (TVar2 == OffsetFromUTC) {
            offsetFromUtc((QDateTime *)
                          CONCAT26(in_stack_fffffffffffffcde.ucs,
                                   CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)));
            toOffsetString(TVar2,iVar7);
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
            QString::~QString((QString *)0x570979);
          }
        }
      }
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                       (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      break;
    case 8:
      QLocale::c(local_68,pDVar4);
      psVar8 = local_78;
      std::data<char16_t_const,22ul>((char16_t (*) [22])L"dd MMM yyyy hh:mm:ss ");
      for (local_228 = 0; local_228 < 0x16; local_228 = local_228 + 1) {
        if (L"dd MMM yyyy hh:mm:ss "[local_228] == L'\0') {
          local_218 = local_228;
          goto LAB_0057041e;
        }
      }
      local_218 = 0x16;
LAB_0057041e:
      QStringView::QStringView<char16_t,_true>
                ((QStringView *)&in_stack_fffffffffffffce0->data,
                 (char16_t *)
                 CONCAT26(in_stack_fffffffffffffcde.ucs,
                          CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
                 CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      format_00.m_data = psVar8;
      format_00.m_size = local_218;
      QLocale::toString((QLocale *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (QDateTime *)in_stack_fffffffffffffcf8,format_00);
      iVar7 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QString::~QString((QString *)0x570498);
      QLocale::~QLocale((QLocale *)0x5704a5);
      offsetFromUtc((QDateTime *)
                    CONCAT26(in_stack_fffffffffffffcde.ucs,
                             CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)));
      toOffsetString(in_stack_fffffffffffffcec,iVar7);
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QString::~QString((QString *)0x5704f1);
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                       (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    }
  }
  else {
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  }
  QString::~QString((QString *)0x570c70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTime::toString(Qt::DateFormat format) const
{
    QString buf;
    if (!isValid())
        return buf;

    switch (format) {
    case Qt::RFC2822Date:
        buf = QLocale::c().toString(*this, u"dd MMM yyyy hh:mm:ss ");
        buf += toOffsetString(Qt::TextDate, offsetFromUtc());
        return buf;
    default:
    case Qt::TextDate: {
        const std::pair<QDate, QTime> p = getDateTime(d);
        buf = toStringTextDate(p.first);
        // Insert time between date's day and year:
        buf.insert(buf.lastIndexOf(u' '),
                   u' ' + p.second.toString(Qt::TextDate));
        // Append zone/offset indicator, as appropriate:
        switch (timeSpec()) {
        case Qt::LocalTime:
            break;
#if QT_CONFIG(timezone)
        case Qt::TimeZone:
            buf += u' ' + d->m_timeZone.displayName(
                *this, QTimeZone::OffsetName, QLocale::c());
            break;
#endif
        default:
#if 0 // ### Qt 7 GMT: use UTC instead, see qnamespace.qdoc documentation
            buf += " UTC"_L1;
#else
            buf += " GMT"_L1;
#endif
            if (getSpec(d) == Qt::OffsetFromUTC)
                buf += toOffsetString(Qt::TextDate, offsetFromUtc());
        }
        return buf;
    }
    case Qt::ISODate:
    case Qt::ISODateWithMs: {
        const std::pair<QDate, QTime> p = getDateTime(d);
        buf = toStringIsoDate(p.first);
        if (buf.isEmpty())
            return QString();   // failed to convert
        buf += u'T' + p.second.toString(format);
        switch (getSpec(d)) {
        case Qt::UTC:
            buf += u'Z';
            break;
        case Qt::OffsetFromUTC:
        case Qt::TimeZone:
            buf += toOffsetString(Qt::ISODate, offsetFromUtc());
            break;
        default:
            break;
        }
        return buf;
    }
    }
}